

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::clear(Calendar *this)

{
  long lVar1;
  
  this->fIsSet[4] = '\0';
  this->fIsSet[5] = '\0';
  this->fIsSet[6] = '\0';
  this->fIsSet[7] = '\0';
  this->fIsSet[8] = '\0';
  this->fIsSet[9] = '\0';
  this->fIsSet[10] = '\0';
  this->fIsSet[0xb] = '\0';
  this->fIsSet[0xc] = '\0';
  this->fIsSet[0xd] = '\0';
  this->fIsSet[0xe] = '\0';
  this->fIsSet[0xf] = '\0';
  this->fIsSet[0x10] = '\0';
  this->fIsSet[0x11] = '\0';
  this->fIsSet[0x12] = '\0';
  this->fIsSet[0x13] = '\0';
  this->fFields[0x14] = 0;
  this->fFields[0x15] = 0;
  *(undefined8 *)(this->fFields + 0x16) = 0;
  this->fFields[0x10] = 0;
  this->fFields[0x11] = 0;
  this->fFields[0x12] = 0;
  this->fFields[0x13] = 0;
  this->fFields[0xc] = 0;
  this->fFields[0xd] = 0;
  this->fFields[0xe] = 0;
  this->fFields[0xf] = 0;
  this->fFields[8] = 0;
  this->fFields[9] = 0;
  this->fFields[10] = 0;
  this->fFields[0xb] = 0;
  this->fFields[4] = 0;
  this->fFields[5] = 0;
  this->fFields[6] = 0;
  this->fFields[7] = 0;
  this->fFields[0] = 0;
  this->fFields[1] = 0;
  this->fFields[2] = 0;
  this->fFields[3] = 0;
  this->fIsSet[0x13] = '\0';
  this->fIsSet[0x14] = '\0';
  this->fIsSet[0x15] = '\0';
  this->fIsSet[0x16] = '\0';
  lVar1 = 0;
  do {
    this->fStamp[lVar1] = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x17);
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  return;
}

Assistant:

void
Calendar::clear()
{
    for (int32_t i=0; i<UCAL_FIELD_COUNT; ++i) {
        fFields[i]     = 0; // Must do this; other code depends on it
        fStamp[i]     = kUnset;
        fIsSet[i]     = FALSE; // Remove later
    }
    fIsTimeSet = fAreFieldsSet = fAreAllFieldsSet = fAreFieldsVirtuallySet = FALSE;
    // fTime is not 'cleared' - may be used if no fields are set.
}